

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void getPLU(double *A,int M,int N,int *ipiv,double *P,double *L,double *U)

{
  int local_38;
  int k;
  int j;
  int i;
  double *L_local;
  double *P_local;
  int *ipiv_local;
  int N_local;
  int M_local;
  double *A_local;
  
  if (P != (double *)0x0) {
    for (k = 0; k < M * M; k = k + 1) {
      P[k] = 0.0;
    }
    for (local_38 = 0; local_38 < M; local_38 = local_38 + 1) {
      P[ipiv[local_38] * M + local_38] = 1.0;
    }
  }
  if (M == N) {
    if (L != (double *)0x0) {
      for (k = 0; k < M; k = k + 1) {
        for (local_38 = 0; local_38 < k; local_38 = local_38 + 1) {
          L[k * M + local_38] = A[k * M + local_38];
        }
        L[k * M + k] = 1.0;
        local_38 = k;
        while (local_38 = local_38 + 1, local_38 < M) {
          L[k * M + local_38] = 0.0;
        }
      }
    }
    if (U != (double *)0x0) {
      for (k = 0; k < M; k = k + 1) {
        for (local_38 = 0; local_38 < k; local_38 = local_38 + 1) {
          U[k * M + local_38] = 0.0;
        }
        for (local_38 = k; local_38 < M; local_38 = local_38 + 1) {
          U[k * M + local_38] = A[k * M + local_38];
        }
      }
    }
  }
  else if (N < M) {
    if (L != (double *)0x0) {
      for (k = 0; k < N; k = k + 1) {
        for (local_38 = 0; local_38 < k; local_38 = local_38 + 1) {
          L[k * N + local_38] = A[k * N + local_38];
        }
        L[k * N + k] = 1.0;
        local_38 = k;
        while (local_38 = local_38 + 1, local_38 < N) {
          L[k * N + local_38] = 0.0;
        }
      }
      memcpy(L + N * N,A + N * N,(long)(M - N) * 8 * (long)N);
    }
    if (U != (double *)0x0) {
      for (k = 0; k < N; k = k + 1) {
        for (local_38 = 0; local_38 < k; local_38 = local_38 + 1) {
          U[k * N + local_38] = 0.0;
        }
        for (local_38 = k; local_38 < N; local_38 = local_38 + 1) {
          U[k * N + local_38] = A[k * N + local_38];
        }
      }
    }
  }
  else if (M < N) {
    if (L != (double *)0x0) {
      for (k = 0; k < M; k = k + 1) {
        for (local_38 = 0; local_38 < k; local_38 = local_38 + 1) {
          L[k * M + local_38] = A[k * N + local_38];
        }
        L[k * M + k] = 1.0;
        local_38 = k;
        while (local_38 = local_38 + 1, local_38 < M) {
          L[k * M + local_38] = 0.0;
        }
      }
    }
    if (U != (double *)0x0) {
      for (k = 0; k < M; k = k + 1) {
        for (local_38 = 0; local_38 < k; local_38 = local_38 + 1) {
          U[k * N + local_38] = 0.0;
        }
        for (local_38 = k; local_38 < N; local_38 = local_38 + 1) {
          U[k * N + local_38] = A[k * N + local_38];
        }
      }
    }
  }
  return;
}

Assistant:

void getPLU(double *A, int M , int N, int *ipiv,double *P, double *L, double *U) {
	int i, j,k;
	// Initialize all the arrays
	// P - M*M 
	// M > N
	// L - M*N , U - N*N
	// M = N
	// L - M*M , U M*M
	// M < N
	// L - M*M, U - M*N

	if (P) {
		for (i = 0; i < M*M; ++i) {
			P[i] = 0.0;
		}
		for (j = 0; j < M; ++j) {
			P[ipiv[j]*M + j] = 1.0;
		}
	}

	if (M == N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*M + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}
		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*M + j] = 0.0;
				}
				for (j = i; j < M; ++j) {
					U[i*M + j] = A[i*M + j];
				}
			}
		}
	}
	else if (M > N) {
		if (L) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*N + j] = A[i*N + j];
				}
				L[i*N + i] = 1.0;
				for (j = i + 1; j < N; ++j) {
					L[i*N + j] = 0.0;
				}
			}
			memcpy(L + N*N, A + N*N, sizeof(double)*(M - N)*N);
		}
		if (U) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
	else if (M < N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*N + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}

		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
}